

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

int __thiscall
booster::aio::basic_socket::get_option(basic_socket *this,integer_option_type opt,error_code *e)

{
  native_type nVar1;
  undefined8 *in_RDX;
  int in_ESI;
  basic_io_device *in_RDI;
  error_code eVar2;
  int res;
  int *ptr;
  socklen_t len;
  int value;
  undefined4 uStack_44;
  int local_34;
  socklen_t local_28;
  int local_24;
  undefined8 *local_20;
  int local_4;
  
  local_24 = 0;
  local_28 = 4;
  local_34 = 0;
  local_20 = in_RDX;
  if (in_ESI == 0) {
    nVar1 = basic_io_device::native(in_RDI);
    local_34 = getsockopt(nVar1,1,8,&local_24,&local_28);
  }
  else if (in_ESI == 1) {
    nVar1 = basic_io_device::native(in_RDI);
    local_34 = getsockopt(nVar1,1,7,&local_24,&local_28);
  }
  if (local_34 < 0) {
    eVar2 = socket_details::geterror();
    *local_20 = CONCAT44(uStack_44,eVar2._M_value);
    local_20[1] = eVar2._M_cat;
    local_4 = 0;
  }
  else {
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int basic_socket::get_option(integer_option_type opt,system::error_code &e)
{
	int value = 0;
	socklen_t len = sizeof(value);
	#ifdef BOOSTER_WIN32
	char *ptr = reinterpret_cast<char *>(&value);
	#else
	int *ptr = &value;
	#endif
	int res = 0;
	switch(opt) {
	case receive_buffer_size:
		res=::getsockopt(native(),SOL_SOCKET,SO_RCVBUF,ptr,&len);
		break;
	case send_buffer_size:
		res=::getsockopt(native(),SOL_SOCKET,SO_SNDBUF,ptr,&len);
		break;
	default:
		;
	}
	if(res < 0) {
		e=geterror();
		return false;
	}
	return value;
}